

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasMemory(Validator *this,Location *loc,Opcode opcode)

{
  pointer ppMVar1;
  pointer ppMVar2;
  char *pcVar3;
  Opcode local_2c [2];
  Opcode opcode_local;
  
  ppMVar1 = (this->current_module_->memories).
            super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar2 = (this->current_module_->memories).
            super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar2 == ppMVar1) {
    local_2c[0].enum_ = opcode.enum_;
    pcVar3 = Opcode::GetName(local_2c);
    PrintError(this,loc,"%s requires an imported or defined memory.",pcVar3);
  }
  return ppMVar2 != ppMVar1;
}

Assistant:

bool Validator::CheckHasMemory(const Location* loc, Opcode opcode) {
  if (current_module_->memories.size() == 0) {
    PrintError(loc, "%s requires an imported or defined memory.",
               opcode.GetName());
    return false;
  }

  return true;
}